

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O1

uint32 Unicode::fromString(char *ch,usize len)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  
  if (len == 0) {
    return 0;
  }
  uVar4 = (uint)(byte)*ch;
  if (-1 < *ch) {
    return uVar4;
  }
  uVar3 = 2;
  if (((uVar4 & 0xffffffe0) != 0xc0) && (uVar3 = 3, (uVar4 & 0xfffffff0) != 0xe0)) {
    uVar3 = (ulong)((uVar4 & 0xfffffff8) == 0xf0) << 2;
  }
  if (len < uVar3) {
    return 0;
  }
  iVar5 = 0;
  iVar2 = (int)uVar3;
  if (iVar2 != 2) {
    if (iVar2 != 3) {
      if (iVar2 != 4) goto LAB_001073fc;
      ch = ch + 1;
      iVar5 = uVar4 << 6;
    }
    bVar1 = *ch;
    ch = (char *)((byte *)ch + 1);
    iVar5 = ((uint)bVar1 + iVar5) * 0x40;
  }
  bVar1 = *ch;
  ch = (char *)((byte *)ch + 1);
  iVar5 = ((uint)bVar1 + iVar5) * 0x40;
LAB_001073fc:
  return ((uint)(byte)*ch + iVar5) - fromString::utf8Offsets[uVar3];
}

Assistant:

static uint32 fromString(const char* ch, usize len)
  {
    if(len == 0)
      return 0;
    if((*(const uchar*)ch & 0x80) == 0) // ch < 0x80
      return *(const uchar*)ch;
    usize reqLen = length(*ch);
    if(len < reqLen)
      return 0;
    static const uint32 utf8Offsets[] = {0UL, 0UL, 0x00003080UL, 0x000E2080UL, 0x03C82080UL};
    uint32 result = 0;
    switch(reqLen)
    {
      case 4: result = (uint32)*(const uchar*)ch++ << 6;
      case 3: result += (uint32)*(const uchar*)ch++; result <<= 6;
      case 2: result += (uint32)*(const uchar*)ch++; result <<= 6;
      default: result += *(const uchar*)ch;
    }
    result -= utf8Offsets[reqLen];
    return result;
  }